

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndicesRef
          (PlanningUnitMADPDiscrete *this,Index jObsHistI)

{
  pointer ppJVar1;
  ulong uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  uVar2 = (ulong)jObsHistI;
  if (this->_m_nrJointObservationHistories <= uVar2) {
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,"PlanningUnitMADPDiscrete::JointToIndividualObservationHistory",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>(local_188,"Indices ERROR: index (",0x16);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") out of bounds!",0x10);
    std::endl<char,std::char_traits<char>>(poVar4);
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar5 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar5,&E::typeinfo,E::~E);
  }
  ppJVar1 = (this->_m_jointObservationHistoryTreeVector).
            super__Vector_base<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)((long)(this->_m_jointObservationHistoryTreeVector).
                            super__Vector_base<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3)) {
    pvVar3 = JointObservationHistory::GetIndividualObservationHistoryIndices
                       ((ppJVar1[uVar2]->super_TreeNode<JointObservationHistory>)._m_containedElem);
    return pvVar3;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar2);
}

Assistant:

const vector<Index>&
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndicesRef(Index
        jObsHistI) const
{
    if(jObsHistI < _m_nrJointObservationHistories)
    {
        JointObservationHistoryTree* joht = 
            _m_jointObservationHistoryTreeVector.at(jObsHistI);
        return(joht->GetJointObservationHistory()->
                GetIndividualObservationHistoryIndices());
    }
    else
    {
        stringstream ss;
        ss << "PlanningUnitMADPDiscrete::JointToIndividualObservationHistory"<<
           "Indices ERROR: index ("<< jObsHistI <<") out of bounds!"<<endl;
        throw E(ss); 
    }
}